

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLDateTime::searchMiliSeconds
          (XMLDateTime *this,XMLCh **miliStartPtr,XMLCh **miliEndPtr)

{
  int iVar1;
  int milisec;
  XMLCh **miliEndPtr_local;
  XMLCh **miliStartPtr_local;
  XMLDateTime *this_local;
  
  *miliEndPtr = (XMLCh *)0x0;
  *miliStartPtr = (XMLCh *)0x0;
  iVar1 = XMLString::indexOf(this->fBuffer,L'.');
  if (iVar1 != -1) {
    *miliStartPtr = this->fBuffer + (long)iVar1 + 1;
    *miliEndPtr = *miliStartPtr;
    while (((**miliEndPtr != L'\0' && (0x2f < (ushort)**miliEndPtr)) &&
           ((ushort)**miliEndPtr < 0x3a))) {
      *miliEndPtr = *miliEndPtr + 1;
    }
    while ((*miliEndPtr)[-1] == L'0') {
      *miliEndPtr = *miliEndPtr + -1;
    }
  }
  return;
}

Assistant:

void XMLDateTime::searchMiliSeconds(XMLCh*& miliStartPtr, XMLCh*& miliEndPtr) const
{
    miliStartPtr = miliEndPtr = 0;

    int milisec = XMLString::indexOf(fBuffer, MILISECOND_SEPARATOR);
    if (milisec == -1)
        return;

    miliStartPtr = fBuffer + milisec + 1;
    miliEndPtr   = miliStartPtr;
    while (*miliEndPtr)
    {
        if ((*miliEndPtr < chDigit_0) || (*miliEndPtr > chDigit_9))
            break;

        miliEndPtr++;
    }

    //remove trailing zeros
    while( *(miliEndPtr - 1) == chDigit_0)
        miliEndPtr--;

    return;
}